

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void * malloc_default(size_t size)

{
  cache_bin_stats_t *pcVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  _Bool _Var6;
  uint ind;
  szind_t sVar7;
  tsd_t *tsd;
  arena_t *paVar8;
  void *__s;
  int *piVar9;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  tcache_t *tcache;
  cache_bin_t *pcVar13;
  char *in_FS_OFFSET;
  uintptr_t args [3];
  size_t local_48 [3];
  
  tsd = *(tsd_t **)in_FS_OFFSET;
  if (*in_FS_OFFSET != '\0') {
    tsd = tsd_fetch_slow(tsd,false);
  }
  if ((tsd->state).repr != '\0') {
    if ((malloc_init_state != malloc_init_initialized) && (_Var6 = malloc_init_hard(), _Var6))
    goto LAB_00132c6d;
    if (size < 0x1001) {
      sVar7 = (szind_t)sz_size2index_tab[size + 7 >> 3];
    }
    else {
      sVar7 = sz_size2index_compute(size);
    }
    if (sVar7 < 0xe8) {
      ind = 0xffffffff;
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
        tcache = (tcache_t *)0x0;
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
          tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
        }
      }
      else {
        ind = 0;
        tcache = (tcache_t *)0x0;
      }
      sVar3 = sz_index2size_tab[sVar7];
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
        paVar8 = (arena_t *)0x0;
      }
      else {
        paVar8 = (arena_t *)arenas[ind].repr;
        if (paVar8 == (arena_t *)0x0) {
          paVar8 = arena_init((tsdn_t *)tsd,ind,&extent_hooks_default);
        }
      }
      if (tcache == (tcache_t *)0x0) {
LAB_00132d3e:
        __s = arena_malloc_hard((tsdn_t *)tsd,paVar8,size,sVar7,false);
      }
      else if (size < 0x3801) {
        pcVar13 = tcache->bins_small + sVar7;
        iVar2 = tcache->bins_small[sVar7].ncached;
        iVar12 = iVar2 + -1;
        tcache->bins_small[sVar7].ncached = iVar12;
        if ((pcVar13->low_water < iVar12) || (pcVar13->low_water = iVar12, iVar2 != 0)) {
          __s = tcache->bins_small[sVar7].avail[-iVar2];
          bVar5 = true;
        }
        else {
          tcache->bins_small[sVar7].ncached = 0;
          bVar5 = false;
          __s = (void *)0x0;
        }
        if (!bVar5) {
          paVar8 = arena_choose(tsd,paVar8);
          if (paVar8 == (arena_t *)0x0) {
            local_48[0]._0_1_ = '\0';
          }
          else {
            __s = tcache_alloc_small_hard
                            ((tsdn_t *)tsd,paVar8,tcache,pcVar13,sVar7,(_Bool *)local_48);
          }
          if ((char)local_48[0] == '\0') {
            __s = (void *)0x0;
            goto LAB_00132c3b;
          }
        }
        if (opt_junk_alloc == true) {
          arena_alloc_junk_small(__s,bin_infos + sVar7,false);
        }
        else if (opt_zero == true) {
          memset(__s,0,sz_index2size_tab[sVar7]);
        }
        pcVar1 = &tcache->bins_small[sVar7].tstats;
        pcVar1->nrequests = pcVar1->nrequests + 1;
        iVar12 = (tcache->gc_ticker).tick;
        (tcache->gc_ticker).tick = iVar12 + -1;
        if (iVar12 < 1) {
          (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
          tcache_event_hard(tsd,tcache);
        }
      }
      else {
        if (tcache_maxclass < size) goto LAB_00132d3e;
        iVar2 = tcache->bins_small[(ulong)sVar7 + 5].ncached;
        iVar12 = iVar2 + -1;
        tcache->bins_small[(ulong)sVar7 + 5].ncached = iVar12;
        if ((tcache->bins_small[(ulong)sVar7 + 5].low_water < iVar12) ||
           (tcache->bins_small[(ulong)sVar7 + 5].low_water = iVar12, iVar2 != 0)) {
          __s = tcache->bins_small[(ulong)sVar7 + 5].avail[-iVar2];
          bVar5 = true;
        }
        else {
          tcache->bins_small[(ulong)sVar7 + 5].ncached = 0;
          bVar5 = false;
          __s = (void *)0x0;
        }
        if (bVar5) {
          if (opt_junk_alloc == true) {
            iVar12 = 0xa5;
LAB_00132fa1:
            memset(__s,iVar12,sz_index2size_tab[sVar7]);
          }
          else if (opt_zero == true) {
            iVar12 = 0;
            goto LAB_00132fa1;
          }
          pcVar1 = &tcache->bins_small[(ulong)sVar7 + 5].tstats;
          pcVar1->nrequests = pcVar1->nrequests + 1;
        }
        else {
          paVar8 = arena_choose(tsd,paVar8);
          if (paVar8 == (arena_t *)0x0) {
LAB_00132f62:
            __s = (void *)0x0;
            goto LAB_00132c3b;
          }
          if (size < 0x7000000000000001) {
            uVar11 = size * 2 - 1;
            lVar4 = 0x3f;
            if (uVar11 != 0) {
              for (; uVar11 >> lVar4 == 0; lVar4 = lVar4 + -1) {
              }
            }
            uVar11 = 0xf;
            if (6 < (uint)lVar4) {
              uVar11 = ~(-1L << ((char)lVar4 - 3U & 0x3f));
            }
            sVar10 = ~uVar11 & uVar11 + size;
          }
          else {
            sVar10 = 0;
          }
          __s = large_malloc((tsdn_t *)tsd,paVar8,sVar10,false);
          if (__s == (void *)0x0) goto LAB_00132f62;
        }
        iVar12 = (tcache->gc_ticker).tick;
        (tcache->gc_ticker).tick = iVar12 + -1;
        if (iVar12 < 1) {
          (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
          tcache_event_hard(tsd,tcache);
        }
      }
LAB_00132c3b:
      if (__s != (void *)0x0) {
        tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated =
             tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated + sVar3;
        bVar5 = true;
        goto LAB_001329d0;
      }
    }
    piVar9 = __errno_location();
    *piVar9 = 0xc;
    bVar5 = true;
    __s = (void *)0x0;
    goto LAB_001329d0;
  }
  if (size < 0x1001) {
    sVar7 = (szind_t)sz_size2index_tab[size + 7 >> 3];
  }
  else {
    sVar7 = sz_size2index_compute(size);
  }
  if (sVar7 < 0xe8) {
    sVar3 = sz_index2size_tab[sVar7];
    if (size < 0x3801) {
      pcVar13 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small +
                sVar7;
      iVar2 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small[sVar7].
              ncached;
      iVar12 = iVar2 + -1;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small[sVar7].ncached
           = iVar12;
      if ((pcVar13->low_water < iVar12) || (pcVar13->low_water = iVar12, iVar2 != 0)) {
        __s = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small[sVar7].
              avail[-iVar2];
        bVar5 = true;
      }
      else {
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small[sVar7].
        ncached = 0;
        bVar5 = false;
        __s = (void *)0x0;
      }
      if (!bVar5) {
        paVar8 = arena_choose(tsd,(arena_t *)0x0);
        if (paVar8 == (arena_t *)0x0) {
          local_48[0]._0_1_ = '\0';
        }
        else {
          __s = tcache_alloc_small_hard
                          ((tsdn_t *)tsd,paVar8,
                           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                           pcVar13,sVar7,(_Bool *)local_48);
        }
        if ((char)local_48[0] == '\0') {
LAB_00132b55:
          __s = (void *)0x0;
          goto LAB_001329c1;
        }
      }
      pcVar1 = &(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
                [sVar7].tstats;
      pcVar1->nrequests = pcVar1->nrequests + 1;
LAB_001329a8:
      iVar12 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.tick;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.tick =
           iVar12 + -1;
      if (iVar12 < 1) {
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.tick =
             (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.nticks;
        tcache_event_hard(tsd,&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache);
      }
    }
    else {
      if (size <= tcache_maxclass) {
        pcVar13 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small +
                  (ulong)sVar7 + 5;
        iVar2 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
                [(ulong)sVar7 + 5].ncached;
        iVar12 = iVar2 + -1;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
        [(ulong)sVar7 + 5].ncached = iVar12;
        if ((pcVar13->low_water < iVar12) || (pcVar13->low_water = iVar12, iVar2 != 0)) {
          __s = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
                [(ulong)sVar7 + 5].avail[-iVar2];
          bVar5 = true;
        }
        else {
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
          [(ulong)sVar7 + 5].ncached = 0;
          bVar5 = false;
          __s = (void *)0x0;
        }
        if (bVar5) {
          pcVar1 = &(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
                    [(ulong)sVar7 + 5].tstats;
          pcVar1->nrequests = pcVar1->nrequests + 1;
        }
        else {
          __s = (void *)0x0;
          paVar8 = arena_choose(tsd,(arena_t *)0x0);
          if (paVar8 == (arena_t *)0x0) goto LAB_001329c1;
          if (size < 0x7000000000000001) {
            uVar11 = size * 2 - 1;
            lVar4 = 0x3f;
            if (uVar11 != 0) {
              for (; uVar11 >> lVar4 == 0; lVar4 = lVar4 + -1) {
              }
            }
            uVar11 = 0xf;
            if (6 < (uint)lVar4) {
              uVar11 = ~(-1L << ((char)lVar4 - 3U & 0x3f));
            }
            sVar10 = ~uVar11 & uVar11 + size;
          }
          else {
            sVar10 = 0;
          }
          __s = large_malloc((tsdn_t *)tsd,paVar8,sVar10,false);
          if (__s == (void *)0x0) goto LAB_00132b55;
        }
        goto LAB_001329a8;
      }
      __s = arena_malloc_hard((tsdn_t *)tsd,(arena_t *)0x0,size,sVar7,false);
    }
LAB_001329c1:
    if (__s == (void *)0x0) goto LAB_00132c6d;
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated =
         tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated + sVar3;
  }
  else {
LAB_00132c6d:
    piVar9 = __errno_location();
    *piVar9 = 0xc;
    __s = (void *)0x0;
  }
  bVar5 = false;
LAB_001329d0:
  if (bVar5) {
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[0] = size;
    hook_invoke_alloc(hook_alloc_malloc,__s,(uintptr_t)__s,local_48);
  }
  return __s;
}

Assistant:

JEMALLOC_NOINLINE
void *
malloc_default(size_t size) {
	void *ret;
	static_opts_t sopts;
	dynamic_opts_t dopts;

	LOG("core.malloc.entry", "size: %zu", size);

	static_opts_init(&sopts);
	dynamic_opts_init(&dopts);

	sopts.null_out_result_on_error = true;
	sopts.set_errno_on_error = true;
	sopts.oom_string = "<jemalloc>: Error in malloc(): out of memory\n";

	dopts.result = &ret;
	dopts.num_items = 1;
	dopts.item_size = size;

	imalloc(&sopts, &dopts);
	/*
	 * Note that this branch gets optimized away -- it immediately follows
	 * the check on tsd_fast that sets sopts.slow.
	 */
	if (sopts.slow) {
		uintptr_t args[3] = {size};
		hook_invoke_alloc(hook_alloc_malloc, ret, (uintptr_t)ret, args);
	}

	LOG("core.malloc.exit", "result: %p", ret);

	return ret;
}